

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# key.cpp
# Opt level: O1

bool __thiscall CExtKey::Derive(CExtKey *this,CExtKey *out,uint _nChild)

{
  bool bVar1;
  long in_FS_OFFSET;
  CKeyID id;
  CPubKey local_8d;
  CKeyID local_4c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->nDepth == 0xff) {
    bVar1 = false;
  }
  else {
    out->nDepth = this->nDepth + '\x01';
    CKey::GetPubKey(&local_8d,&this->key);
    CPubKey::GetID(&local_4c,&local_8d);
    *(undefined4 *)out->vchFingerprint =
         local_4c.super_uint160.super_base_blob<160U>.m_data._M_elems._0_4_;
    out->nChild = _nChild;
    bVar1 = CKey::Derive(&this->key,&out->key,&out->chaincode,_nChild,&this->chaincode);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool CExtKey::Derive(CExtKey &out, unsigned int _nChild) const {
    if (nDepth == std::numeric_limits<unsigned char>::max()) return false;
    out.nDepth = nDepth + 1;
    CKeyID id = key.GetPubKey().GetID();
    memcpy(out.vchFingerprint, &id, 4);
    out.nChild = _nChild;
    return key.Derive(out.key, out.chaincode, _nChild, chaincode);
}